

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<const_char_(&)[13],_QString> *b)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  char16_t *__src;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QChar *it;
  QChar *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (a->d).d;
  lVar3 = (a->d).size;
  lVar4 = (b->b).d.size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar3);
  }
  lVar3 = lVar3 + lVar4 + 0xc;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar2->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar4 < lVar3) {
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar4 < lVar3) {
      lVar4 = lVar3;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar4)) {
      lVar3 = (a->d).size;
      if (lVar4 < lVar3) {
        lVar4 = lVar3;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar4);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  local_30 = (QChar *)((a->d).ptr + (a->d).size);
  QVar5.m_data = *b->a;
  QVar5.m_size = 0xc;
  QAbstractConcatenable::convertFromUtf8(QVar5,&local_30);
  lVar3 = (b->b).d.size;
  if (lVar3 != 0) {
    __src = (b->b).d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(local_30,__src,lVar3 * 2);
  }
  local_30 = local_30 + lVar3;
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}